

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

int Minisat::parseInt<Minisat::StreamBuffer>(StreamBuffer *in)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  
  skipWhitespace<Minisat::StreamBuffer>(in);
  iVar2 = in->pos;
  if (iVar2 < in->size) {
    if (in->buf[iVar2] == '-') {
      bVar1 = true;
    }
    else {
      if (in->buf[iVar2] != '+') goto LAB_001030a4;
      bVar1 = false;
    }
    in->pos = iVar2 + 1;
    StreamBuffer::assureLookahead(in);
  }
  else {
LAB_001030a4:
    bVar1 = false;
  }
  iVar2 = in->pos;
  if ((in->size <= iVar2) || ((byte)(in->buf[iVar2] - 0x3a) < 0xf6)) {
    parseInt<Minisat::StreamBuffer>();
    return extraout_EAX;
  }
  iVar3 = 0;
  do {
    if (9 < (byte)(in->buf[iVar2] - 0x30)) break;
    iVar3 = (uint)in->buf[iVar2] + iVar3 * 10 + -0x30;
    in->pos = iVar2 + 1;
    StreamBuffer::assureLookahead(in);
    iVar2 = in->pos;
  } while (iVar2 < in->size);
  iVar2 = -iVar3;
  if (!bVar1) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int parseInt(B& in) {
    int     val = 0;
    bool    neg = false;
    skipWhitespace(in);
    if      (*in == '-') neg = true, ++in;
    else if (*in == '+') ++in;
    if (*in < '0' || *in > '9') fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", *in), exit(3);
    while (*in >= '0' && *in <= '9')
        val = val*10 + (*in - '0'),
        ++in;
    return neg ? -val : val; }